

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

substr __thiscall
c4::yml::Parser::_scan_complex_key(Parser *this,csubstr currscalar,csubstr peeked_line)

{
  char *pcVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  char *pcVar13;
  size_t sVar14;
  ro_substr chars;
  substr sVar15;
  csubstr cVar16;
  char msg [43];
  substr full;
  csubstr local_128;
  size_t local_110;
  char local_108 [40];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined2 local_d8;
  ulong local_d0;
  char *local_c8;
  size_t local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  substr local_40;
  
  sVar7 = currscalar.len;
  pcVar13 = currscalar.str;
  sVar8 = (this->m_buf).len;
  local_128 = peeked_line;
  if (sVar8 == 0) {
    if (sVar7 == 0) {
      pcVar1 = (this->m_buf).str;
      bVar6 = pcVar1 != (char *)0x0 && pcVar1 == pcVar13;
      goto LAB_001e104c;
    }
  }
  else {
    pcVar1 = (this->m_buf).str;
    bVar6 = pcVar13 + sVar7 <= pcVar1 + sVar8 && pcVar1 <= pcVar13;
LAB_001e104c:
    if (bVar6) goto LAB_001e1109;
  }
  builtin_strncpy(local_108 + 0x20,"rrscalar",8);
  uStack_e0 = CONCAT13(uStack_e0._3_1_,0x2929);
  builtin_strncpy(local_108 + 0x10,"_buf.is_super(cu",0x10);
  builtin_strncpy(local_108,"check failed: (m",0x10);
  if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
    pcVar2 = (code *)swi(3);
    sVar15 = (substr)(*pcVar2)();
    return sVar15;
  }
  local_68 = 0;
  uStack_60 = 0x75cb;
  local_58 = 0;
  pcStack_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_48 = 0x65;
  LVar3.super_LineCol.col = 0;
  LVar3.super_LineCol.offset = SUB168(ZEXT816(0x75cb) << 0x40,0);
  LVar3.super_LineCol.line = SUB168(ZEXT816(0x75cb) << 0x40,8);
  LVar3.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar3.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            (local_108,0x2b,LVar3,(this->m_stack).m_callbacks.m_user_data);
LAB_001e1109:
  if (pcVar13 + sVar7 < (this->m_buf).str) {
    builtin_strncpy(local_108 + 0x20,">= m_buf",8);
    uStack_e0 = 0x6765622e;
    uStack_dc = 0x29286e69;
    builtin_strncpy(local_108 + 0x10,"urrscalar.end() ",0x10);
    builtin_strncpy(local_108,"check failed: (c",0x10);
    local_d8 = 0x29;
    if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      sVar15 = (substr)(*pcVar2)();
      return sVar15;
    }
    local_90 = 0;
    uStack_88 = 0x75ce;
    local_80 = 0;
    pcStack_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x75ce) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x75ce) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_108,0x32,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  local_d0 = (long)(pcVar13 + sVar7) - (long)(this->m_buf).str;
  local_c8 = pcVar13;
  local_c0 = sVar7;
  do {
    if (2 < local_128.len) {
      if (*local_128.str == '.') {
        uVar10 = 0;
        do {
          uVar9 = uVar10;
          if (uVar9 == 2) break;
          uVar10 = uVar9 + 1;
        } while (local_128.str[uVar9 + 1] == "\t..."[uVar9 + 2]);
        if (1 < uVar9) goto LAB_001e1411;
      }
      if ((2 < local_128.len) && (*local_128.str == '-')) {
        uVar10 = 0;
        do {
          uVar9 = uVar10;
          if (uVar9 == 2) break;
          uVar10 = uVar9 + 1;
        } while (local_128.str[uVar9 + 1] == "---"[uVar9 + 1]);
        if (1 < uVar9) goto LAB_001e1411;
      }
    }
    sVar8 = 0;
    chars.len = 6;
    chars.str = "?:[]{}";
    sVar7 = basic_substring<const_char>::first_of(&local_128,chars,0);
    if (sVar7 == 0xffffffffffffffff) {
      sVar7 = 0xffffffffffffffff;
      if ((1 < local_128.len) && (sVar14 = local_128.len - 1, local_128.len != 1)) {
        sVar11 = 0;
        do {
          bVar6 = true;
          lVar12 = 0;
          sVar7 = sVar8;
          do {
            if (local_128.len <= sVar11 + lVar12) {
              local_110 = sVar7;
              _scan_complex_key();
              sVar7 = local_110;
            }
            sVar8 = sVar7;
            if (local_128.str[lVar12 + sVar11] != "--- "[lVar12 + 2]) break;
            bVar6 = lVar12 == 0;
            lVar12 = lVar12 + 1;
            sVar8 = sVar11;
          } while (lVar12 != 2);
          sVar7 = sVar8;
        } while ((bVar6) && (sVar11 = sVar11 + 1, sVar7 = 0xffffffffffffffff, sVar11 != sVar14));
      }
    }
    if (sVar7 != 0xffffffffffffffff) {
LAB_001e1409:
      _line_progressed(this,sVar7);
LAB_001e1411:
      sVar8 = local_c0;
      uVar10 = local_d0;
      if ((this->m_state->pos).super_LineCol.offset < local_d0) {
        builtin_strncpy(local_108 + 0x20,"et >= of",8);
        uStack_e0 = 0x297366;
        builtin_strncpy(local_108 + 0x10,"_state->pos.offs",0x10);
        builtin_strncpy(local_108,"check failed: (m",0x10);
        if (((s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
          pcVar2 = (code *)swi(3);
          sVar15 = (substr)(*pcVar2)();
          return sVar15;
        }
        local_b8 = 0;
        uStack_b0 = 0x7609;
        local_a8 = 0;
        pcStack_a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_98 = 0x65;
        LVar5.super_LineCol.col = 0;
        LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7609) << 0x40,0);
        LVar5.super_LineCol.line = SUB168(ZEXT816(0x7609) << 0x40,8);
        LVar5.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar5.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_108,0x2c,LVar5,(this->m_stack).m_callbacks.m_user_data);
      }
      basic_substring<char>::basic_substring
                (&local_40,local_c8,(sVar8 - uVar10) + (this->m_state->pos).super_LineCol.offset);
      return local_40;
    }
    cVar16 = _scan_to_next_nonempty_line(this,0);
    uVar10 = cVar16.len;
    if ((uVar10 == 0) || (cVar16.str == (char *)0x0)) goto LAB_001e1411;
    sVar7 = 0xffffffffffffffff;
    local_128 = cVar16;
    if ((1 < uVar10) && (uVar10 != 1)) {
      sVar14 = 0;
      do {
        bVar6 = true;
        lVar12 = 0;
        sVar7 = sVar8;
        do {
          if (local_128.len <= sVar14 + lVar12) {
            local_110 = sVar7;
            _scan_complex_key();
            sVar7 = local_110;
          }
          sVar8 = sVar7;
          if (local_128.str[lVar12 + sVar14] != "\": "[lVar12 + 1]) break;
          bVar6 = lVar12 == 0;
          lVar12 = lVar12 + 1;
          sVar8 = sVar14;
        } while (lVar12 != 2);
        sVar7 = sVar8;
      } while ((bVar6) && (sVar14 = sVar14 + 1, sVar7 = 0xffffffffffffffff, sVar14 != uVar10 - 1));
    }
    if (sVar7 != 0xffffffffffffffff) goto LAB_001e1409;
    bVar6 = _advance_to_peeked(this);
    if (!bVar6) goto LAB_001e1411;
    local_128 = (this->m_state->line_contents).rem;
  } while( true );
}

Assistant:

substr Parser::_scan_complex_key(csubstr currscalar, csubstr peeked_line)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(currscalar));
    // NOTE. there's a problem with _scan_to_next_nonempty_line(), as it counts newlines twice
    // size_t offs = m_state->pos.offset;   // so we workaround by directly counting from the end of the given scalar
    _RYML_CB_ASSERT(m_stack.m_callbacks, currscalar.end() >= m_buf.begin());
    size_t offs = static_cast<size_t>(currscalar.end() - m_buf.begin());
    while(true)
    {
        _c4dbgp("rcplxkey: continuing...");
        if(peeked_line.begins_with("...") || peeked_line.begins_with("---"))
        {
            _c4dbgpf("rcplxkey: document termination next -- bail now '{}'", peeked_line.trimr("\r\n"));
            break;
        }
        else
        {
            size_t pos = peeked_line.first_of("?:[]{}");
            if(pos == csubstr::npos)
            {
                pos = peeked_line.find("- ");
            }
            if(pos != csubstr::npos)
            {
                _c4dbgpf("rcplxkey: found special characters at pos={}: '{}'", pos, peeked_line.trimr("\r\n"));
                _line_progressed(pos);
                break;
            }
        }

        _c4dbgpf("rcplxkey: no special chars found '{}'", peeked_line.trimr("\r\n"));
        csubstr next_peeked = _scan_to_next_nonempty_line(0);
        if(next_peeked.empty())
        {
            _c4dbgp("rcplxkey: empty ... finished.");
            break;
        }
        _c4dbgp("rcplxkey: ... continuing.");
        peeked_line = next_peeked;

        _c4dbgpf("rcplxkey: line contents: '{}'", peeked_line.trimr("\r\n"));
        size_t colpos;
        if((colpos = peeked_line.find(": ")) != npos)
        {
            _c4dbgp("rcplxkey: found ': ', stopping.");
            _line_progressed(colpos);
            break;
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        else if((colpos = peeked_line.ends_with(':')))
        {
            _c4dbgp("rcplxkey: ends with ':', stopping.");
            _line_progressed(colpos);
            break;
        }
        #endif
        _c4dbgpf("rcplxkey: append another line: (len={})'{}'", peeked_line.len, peeked_line.trimr("\r\n"));
        if(!_advance_to_peeked())
        {
            _c4dbgp("rcplxkey: file finishes after the scalar");
            break;
        }
        peeked_line = m_state->line_contents.rem;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= offs);
    substr full(m_buf.str + (currscalar.str - m_buf.str),
                currscalar.len + (m_state->pos.offset - offs));
    return full;
}